

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O2

void __thiscall fizplex::LP::add_value(LP *this,size_t row,size_t column,double value)

{
  uint __line;
  char *__assertion;
  
  if (row < (ulong)(((long)(this->rows).
                           super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->rows).
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    if (column < (ulong)(((long)(this->cols).
                                super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->cols).
                               super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      ColMatrix::add_value(&this->A,row,column,value);
      return;
    }
    __assertion = "column < column_count()";
    __line = 0x41;
  }
  else {
    __assertion = "row < row_count()";
    __line = 0x40;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc",
                __line,"void fizplex::LP::add_value(size_t, size_t, double)");
}

Assistant:

void LP::add_value(size_t row, size_t column, double value) {
  assert(row < row_count());
  assert(column < column_count());

  A.add_value(row, column, value);
}